

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenuEx(char *label,char *icon,bool enabled)

{
  ImGuiID IVar1;
  ImDrawList *draw_list;
  bool bVar2;
  bool bVar3;
  float fVar4;
  bool bVar5;
  ImU32 col;
  ImGuiPopupData *pIVar6;
  uint *puVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  float fVar14;
  ImGuiWindow *local_1b8;
  byte local_1a9;
  float local_180;
  ImVec2 local_150;
  float local_148;
  float fStack_144;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  float ref_unit;
  ImGuiWindow *child_menu_window;
  bool moving_toward_other_child_menu;
  bool want_close;
  bool want_open;
  bool hovered;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 text_pos_1;
  float extra_w;
  float min_w;
  float checkmark_w;
  ImVec2 IStack_b0;
  float icon_w;
  ImVec2 local_a8;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 text_pos;
  float w;
  ImVec2 local_80;
  bool *local_78;
  ImGuiMenuColumns *offsets;
  ImVec2 pos;
  ImVec2 popup_pos;
  ImGuiWindow *backed_nav_window;
  bool menuset_is_open;
  bool pressed;
  ImVec2 label_size;
  ImGuiWindowFlags flags;
  bool menu_is_open;
  ImGuiStyle *pIStack_40;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *pcStack_20;
  bool enabled_local;
  char *icon_local;
  char *label_local;
  
  window._7_1_ = enabled;
  pcStack_20 = icon;
  icon_local = label;
  g = (ImGuiContext *)GetCurrentWindow();
  if (((g->IO).ConfigViewportsNoAutoMerge & 1U) == 0) {
    style = (ImGuiStyle *)GImGui;
    pIStack_40 = &GImGui->Style;
    flags = ImGuiWindow::GetID((ImGuiWindow *)g,icon_local,(char *)0x0);
    label_size.y._3_1_ = IsPopupOpen(flags,0);
    label_size.x = 2.682225e-29;
    if (((g->IO).BackendFlags & 0x14000000U) != 0) {
      label_size.x = 1.07289e-28;
    }
    bVar5 = ImVector<unsigned_int>::contains
                      ((ImVector<unsigned_int> *)(style[0xb].Colors + 0x2c),(uint *)&flags);
    if (bVar5) {
      if (label_size.y._3_1_) {
        label_size.y._3_1_ = BeginPopupEx(flags,(ImGuiWindowFlags)label_size.x);
      }
      else {
        ImGuiNextWindowData::ClearFlags((ImGuiNextWindowData *)&style[7].TabMinWidthForCloseButton);
      }
      label_local._7_1_ = label_size.y._3_1_;
    }
    else {
      ImVector<unsigned_int>::push_back
                ((ImVector<unsigned_int> *)(style[0xb].Colors + 0x2c),(uint *)&flags);
      IVar13 = CalcTextSize(icon_local,(char *)0x0,true,-1.0);
      bVar5 = false;
      if ((((g->IO).BackendFlags & 0x4000000U) == 0) &&
         (bVar5 = false, (int)style[7].Colors[0xc].z < (int)style[7].Colors[0xb].z)) {
        pIVar6 = ImVector<ImGuiPopupData>::operator[]
                           ((ImVector<ImGuiPopupData> *)&style[7].Colors[0xb].z,
                            (int)style[7].Colors[0xc].z);
        IVar1 = pIVar6->OpenParentId;
        puVar7 = ImVector<unsigned_int>::back
                           ((ImVector<unsigned_int> *)&(g->IO).BackendLanguageUserData);
        bVar5 = IVar1 == *puVar7;
      }
      fVar12 = style[7].Colors[0x13].z;
      fVar4 = style[7].Colors[0x13].w;
      if (bVar5) {
        *(ImGuiContext **)&style[7].Colors[0x13].z = g;
      }
      ImVec2::ImVec2(&pos);
      offsets = (ImGuiMenuColumns *)(g->IO).SetClipboardTextFn;
      PushID(icon_local);
      if ((window._7_1_ & 1) == 0) {
        BeginDisabled(true);
      }
      local_78 = (g->IO).KeysDown + 0x34;
      backed_nav_window._4_4_ = IVar13.x;
      if (*(int *)((g->IO).KeysDown + 0x7c) == 0) {
        fVar14 = offsets._0_4_ + -1.0;
        fVar11 = (pIStack_40->ItemSpacing).x;
        fVar9 = offsets._4_4_ - (pIStack_40->FramePadding).y;
        fVar10 = ImGuiWindow::MenuBarHeight((ImGuiWindow *)g);
        ImVec2::ImVec2(&local_80,fVar14 - (float)(int)(fVar11 * 0.5),fVar9 + fVar10);
        pos = local_80;
        *(float *)&(g->IO).SetClipboardTextFn =
             *(float *)&(g->IO).SetClipboardTextFn + (float)(int)((pIStack_40->ItemSpacing).x * 0.5)
        ;
        fVar11 = (pIStack_40->ItemSpacing).x;
        ImVec2::ImVec2((ImVec2 *)&text_pos.y,fVar11 + fVar11,(pIStack_40->ItemSpacing).y);
        PushStyleVar(0xe,(ImVec2 *)&text_pos.y);
        text_pos.x = backed_nav_window._4_4_;
        ImVec2::ImVec2(&local_94,
                       *(float *)&(g->IO).SetClipboardTextFn + (float)*(ushort *)(local_78 + 0xc),
                       *(float *)((long)&(g->IO).SetClipboardTextFn + 4) +
                       *(float *)((g->IO).KeysDown + 8));
        ImVec2::ImVec2(&local_9c,text_pos.x,0.0);
        backed_nav_window._3_1_ = Selectable("",label_size.y._3_1_,0x500001,&local_9c);
        local_a8 = local_94;
        RenderText(local_94,icon_local,(char *)0x0,true);
        PopStyleVar(1);
        *(float *)&(g->IO).SetClipboardTextFn =
             (float)(int)((pIStack_40->ItemSpacing).x * -0.5) +
             *(float *)&(g->IO).SetClipboardTextFn;
      }
      else {
        ImVec2::ImVec2(&stack0xffffffffffffff50,offsets._0_4_,
                       offsets._4_4_ - (pIStack_40->WindowPadding).y);
        pos = IStack_b0;
        if ((pcStack_20 == (char *)0x0) || (*pcStack_20 == '\0')) {
          local_180 = 0.0;
        }
        else {
          IVar13 = CalcTextSize(pcStack_20,(char *)0x0,false,-1.0);
          min_w = IVar13.x;
          local_180 = min_w;
        }
        fVar11 = ImGuiMenuColumns::DeclColumns
                           ((ImGuiMenuColumns *)((g->IO).KeysDown + 0x34),local_180,
                            backed_nav_window._4_4_,0.0,(float)(int)(style[6].Colors[7].x * 1.2));
        text_pos_1 = GetContentRegionAvail();
        fVar9 = ImMax<float>(0.0,text_pos_1.x - fVar11);
        ImVec2::ImVec2(&local_d8,
                       *(float *)&(g->IO).SetClipboardTextFn + (float)*(ushort *)(local_78 + 0xc),
                       *(float *)((long)&(g->IO).SetClipboardTextFn + 4) +
                       *(float *)((g->IO).KeysDown + 8));
        ImVec2::ImVec2(&local_e0,fVar11,0.0);
        backed_nav_window._3_1_ = Selectable("",label_size.y._3_1_,0x1500001,&local_e0);
        local_e8 = local_d8;
        RenderText(local_d8,icon_local,(char *)0x0,true);
        if (0.0 < local_180) {
          ImVec2::ImVec2(&local_f8,(float)*(ushort *)(local_78 + 10),0.0);
          local_f0 = operator+((ImVec2 *)&offsets,&local_f8);
          RenderText(local_f0,pcStack_20,(char *)0x0,true);
        }
        draw_list = *(ImDrawList **)((g->IO).KeysDown + 0x168);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef8,
                       style[6].Colors[7].x * 0.3 + (float)*(ushort *)(local_78 + 0x10) + fVar9,0.0)
        ;
        local_100 = operator+((ImVec2 *)&offsets,(ImVec2 *)&stack0xfffffffffffffef8);
        col = GetColorU32(0,1.0);
        RenderArrow(draw_list,local_100,col,1,1.0);
      }
      if ((window._7_1_ & 1) == 0) {
        EndDisabled();
      }
      local_1a9 = 0;
      if (style[6].Colors[0x34].x == (float)flags) {
        local_1a9 = window._7_1_;
      }
      local_1a9 = local_1a9 & 1;
      if (bVar5) {
        style[7].Colors[0x13].z = fVar12;
        style[7].Colors[0x13].w = fVar4;
      }
      bVar3 = false;
      bVar2 = false;
      if (*(int *)((g->IO).KeysDown + 0x7c) == 1) {
        child_menu_window._4_1_ = false;
        if (((int)style[7].Colors[0xc].z < (int)style[7].Colors[0xb].z) &&
           (pIVar6 = ImVector<ImGuiPopupData>::operator[]
                               ((ImVector<ImGuiPopupData> *)&style[7].Colors[0xb].z,
                                (int)style[7].Colors[0xc].z),
           (ImGuiContext *)pIVar6->SourceWindow == g)) {
          pIVar6 = ImVector<ImGuiPopupData>::operator[]
                             ((ImVector<ImGuiPopupData> *)&style[7].Colors[0xb].z,
                              (int)style[7].Colors[0xc].z);
          local_1b8 = pIVar6->Window;
        }
        else {
          local_1b8 = (ImGuiWindow *)0x0;
        }
        if (((*(ImGuiContext **)&style[6].Colors[0x30].z == g) && (local_1b8 != (ImGuiWindow *)0x0))
           && (((g->IO).BackendFlags & 0x400U) == 0)) {
          fVar12 = style[6].Colors[7].x;
          _ta = ImGuiWindow::Rect(local_1b8);
          tb = operator-((ImVec2 *)&style->Colors[5].z,(ImVec2 *)&style->Colors[0x2e].z);
          if ((local_1b8->Pos).x <= (float)(g->IO).KeyMap[3]) {
            tc = ImRect::GetTR((ImRect *)&ta);
          }
          else {
            tc = ImRect::GetTL((ImRect *)&ta);
          }
          if ((local_1b8->Pos).x <= (float)(g->IO).KeyMap[3]) {
            _fStack_144 = ImRect::GetBR((ImRect *)&ta);
          }
          else {
            _fStack_144 = ImRect::GetBL((ImRect *)&ta);
          }
          local_148 = ImClamp<float>(ABS(tb.x - tc.x) * 0.3,fVar12 * 0.5,fVar12 * 2.5);
          uVar8 = -(uint)((float)(g->IO).KeyMap[3] < (local_1b8->Pos).x);
          fVar4 = tb.y;
          tb.x = (float)(~uVar8 & 0x3f000000 | uVar8 & 0xbf000000) + tb.x;
          fVar11 = ImMax<float>((tc.y - local_148) - tb.y,-fVar12 * 8.0);
          tc.y = fVar4 + fVar11;
          fVar4 = tb.y;
          fVar12 = ImMin<float>((extra + local_148) - tb.y,fVar12 * 8.0);
          extra = fVar4 + fVar12;
          child_menu_window._4_1_ =
               ImTriangleContainsPoint
                         (&tb,&tc,(ImVec2 *)&stack0xfffffffffffffebc,(ImVec2 *)&style->Colors[5].z);
        }
        if ((((label_size.y._3_1_) && (local_1a9 == 0)) &&
            ((*(ImGuiContext **)&style[6].Colors[0x30].z == g &&
             ((style[6].Colors[0x34].y != 0.0 && (style[6].Colors[0x34].y != (float)flags)))))) &&
           (child_menu_window._4_1_ == false)) {
          bVar2 = true;
        }
        if ((label_size.y._3_1_) || (backed_nav_window._3_1_ == false)) {
          if ((!label_size.y._3_1_) && ((local_1a9 != 0 && (child_menu_window._4_1_ == false)))) {
            bVar3 = true;
          }
        }
        else {
          bVar3 = true;
        }
        if ((style[7].Colors[0x14].x == (float)flags) && (style[7].Colors[0x1a].w == 1.4013e-45)) {
          bVar3 = true;
          NavMoveRequestCancel();
        }
      }
      else if (((label_size.y._3_1_) && (backed_nav_window._3_1_ != false)) && (bVar5)) {
        bVar2 = true;
        label_size.y._3_1_ = false;
        bVar3 = false;
      }
      else if ((backed_nav_window._3_1_ != false) ||
              (((local_1a9 != 0 && (bVar5)) && (!label_size.y._3_1_)))) {
        bVar3 = true;
      }
      else if ((style[7].Colors[0x14].x == (float)flags) && (style[7].Colors[0x1a].w == 4.2039e-45))
      {
        bVar3 = true;
        NavMoveRequestCancel();
      }
      if ((window._7_1_ & 1) == 0) {
        bVar2 = true;
      }
      if ((bVar2) && (bVar5 = IsPopupOpen(flags,0), bVar5)) {
        ClosePopupToLevel((int)style[7].Colors[0xc].z,true);
      }
      PopID();
      if (((label_size.y._3_1_ == false) && (bVar3)) &&
         ((int)style[7].Colors[0xc].z < (int)style[7].Colors[0xb].z)) {
        OpenPopup(icon_local,0);
        label_local._7_1_ = false;
      }
      else {
        bVar5 = label_size.y._3_1_ != false;
        label_size.y._3_1_ = bVar5 || bVar3;
        if (bVar3) {
          OpenPopup(icon_local,0);
        }
        if (bVar5 || bVar3) {
          ImVec2::ImVec2(&local_150,0.0,0.0);
          SetNextWindowPos(&pos,1,&local_150);
          label_size.y._3_1_ = BeginPopupEx(flags,(ImGuiWindowFlags)label_size.x);
        }
        else {
          ImGuiNextWindowData::ClearFlags
                    ((ImGuiNextWindowData *)&style[7].TabMinWidthForCloseButton);
        }
        label_local._7_1_ = label_size.y._3_1_;
      }
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::BeginMenuEx(const char* label, const char* icon, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    bool menu_is_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
    ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
    if (window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu))
        flags |= ImGuiWindowFlags_ChildWindow;

    // If a menu with same the ID was already submitted, we will append to it, matching the behavior of Begin().
    // We are relying on a O(N) search - so O(N log N) over the frame - which seems like the most efficient for the expected small amount of BeginMenu() calls per frame.
    // If somehow this is ever becoming a problem we can switch to use e.g. ImGuiStorage mapping key to last frame used.
    if (g.MenusIdSubmittedThisFrame.contains(id))
    {
        if (menu_is_open)
            menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        else
            g.NextWindowData.ClearFlags();          // we behave like Begin() and need to consume those values
        return menu_is_open;
    }

    // Tag menu as used. Next time BeginMenu() with same ID is called it will append to existing menu
    g.MenusIdSubmittedThisFrame.push_back(id);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    bool pressed;
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is chosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    PushID(label);
    if (!enabled)
        BeginDisabled();
    const ImGuiMenuColumns* offsets = &window->DC.MenuColumns;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - IM_FLOOR(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        pressed = Selectable("", menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups, ImVec2(w, 0.0f));
        RenderText(text_pos, label);
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a regular/vertical menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float icon_w = (icon && icon[0]) ? CalcTextSize(icon, NULL).x : 0.0f;
        float checkmark_w = IM_FLOOR(g.FontSize * 1.20f);
        float min_w = window->DC.MenuColumns.DeclColumns(icon_w, label_size.x, 0.0f, checkmark_w); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        pressed = Selectable("", menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_SpanAvailWidth, ImVec2(min_w, 0.0f));
        RenderText(text_pos, label);
        if (icon_w > 0.0f)
            RenderText(pos + ImVec2(offsets->OffsetIcon, 0.0f), icon);
        RenderArrow(window->DrawList, pos + ImVec2(offsets->OffsetMark + extra_w + g.FontSize * 0.30f, 0.0f), GetColorU32(ImGuiCol_Text), ImGuiDir_Right);
    }
    if (!enabled)
        EndDisabled();

    const bool hovered = (g.HoveredId == id) && enabled;
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_other_child_menu = false;
        ImGuiWindow* child_menu_window = (g.BeginPopupStack.Size < g.OpenPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].SourceWindow == window) ? g.OpenPopupStack[g.BeginPopupStack.Size].Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            float ref_unit = g.FontSize; // FIXME-DPI
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = (g.IO.MousePos - g.IO.MouseDelta);
            ImVec2 tb = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, ref_unit * 0.5f, ref_unit * 2.5f);   // add a bit of extra slack.
            ta.x += (window->Pos.x < child_menu_window->Pos.x) ? -0.5f : +0.5f;                     // to avoid numerical issues (FIXME: ??)
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -ref_unit * 8.0f);                           // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +ref_unit * 8.0f);
            moving_toward_other_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_toward_other_child_menu ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }
        if (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_toward_other_child_menu)
            want_close = true;

        // Open
        if (!menu_is_open && pressed) // Click/activate to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_other_child_menu) // Hover to open
            want_open = true;
        if (g.NavId == id && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id, ImGuiPopupFlags_None))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));
    PopID();

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiCond_Always); // Note: this is super misleading! The value will serve as reference for FindBestWindowPosForPopup(), not actual pos.
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }
    else
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    }

    return menu_is_open;
}